

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

vec3 golf_json_object_get_vec3(JSON_Object *obj,char *name)

{
  vec3 vVar1;
  JSON_Array *array_00;
  double dVar2;
  double dVar3;
  double dVar4;
  JSON_Array *array;
  char *name_local;
  JSON_Object *obj_local;
  vec3 v;
  
  array_00 = json_object_get_array(obj,name);
  dVar2 = json_array_get_number(array_00,0);
  dVar3 = json_array_get_number(array_00,1);
  dVar4 = json_array_get_number(array_00,2);
  vVar1.y = (float)dVar3;
  vVar1.x = (float)dVar2;
  vVar1.z = (float)dVar4;
  return vVar1;
}

Assistant:

vec3 golf_json_object_get_vec3(JSON_Object *obj, const char *name) {
    JSON_Array *array = json_object_get_array(obj, name);
    vec3 v;
    v.x = (float)json_array_get_number(array, 0);
    v.y = (float)json_array_get_number(array, 1);
    v.z = (float)json_array_get_number(array, 2);
    return v;
}